

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::setIconSize(QAbstractButton *this,QSize *size)

{
  long lVar1;
  bool bVar2;
  QAbstractButtonPrivate *pQVar3;
  QSize *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractButton *)0x5013cf);
  bVar2 = ::operator==((QSize *)in_RDI,(QSize *)in_stack_ffffffffffffffc8);
  if (!bVar2) {
    pQVar3->iconSize = *in_RSI;
    QSize::QSize((QSize *)in_RDI);
    pQVar3->sizeHint = local_10;
    QWidget::updateGeometry(in_RDI);
    bVar2 = QWidget::isVisible((QWidget *)0x501435);
    if (bVar2) {
      QWidget::update(in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::setIconSize(const QSize &size)
{
    Q_D(QAbstractButton);
    if (d->iconSize == size)
        return;

    d->iconSize = size;
    d->sizeHint = QSize();
    updateGeometry();
    if (isVisible()) {
        update();
    }
}